

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O3

Vec_Str_t *
Super_PrecomputeStr(Mio_Library_t *pLibGen,int nVarsMax,int nLevels,int nGatesMax,float tDelayMax,
                   float tAreaMax,int TimeLimit,int fSkipInv,int fVerbose)

{
  uint *puVar1;
  float *pfVar2;
  uint uVar3;
  Super_Gate_t *pSVar4;
  Super_Gate_t *pSVar5;
  Super_Gate_t *pSVar6;
  Super_Gate_t *pSVar7;
  Mio_Gate_t *pMVar8;
  Super_Gate_t_conflict *pSVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  long lVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  Super_Man_t *pMan;
  Extra_MmFixed_t *pEVar16;
  stmm_table *psVar17;
  char *pcVar18;
  Super_Gate_t_conflict **ppSVar19;
  Super_Gate_t_conflict *pSVar20;
  stmm_generator *psVar21;
  ProgressBar *pPro;
  long *__base;
  Super_Gate_t *pSVar22;
  char *pcVar23;
  FILE *__s;
  char *pcVar24;
  Vec_Str_t *pVVar25;
  ulong uVar26;
  Super_Gate_t *pSVar27;
  uint uVar28;
  long lVar29;
  abctime aVar30;
  long lVar31;
  Super_Gate_t *pSVar32;
  Super_Gate_t *pSVar33;
  Mio_Gate_t **ppMVar34;
  ulong uVar35;
  Super_Gate_t *pSVar36;
  Super_Gate_t *pSVar37;
  Super_Gate_t *pSVar38;
  Super_Gate_t *pSVar39;
  Super_Man_t *pSVar40;
  Super_Gate_t *pSVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  float tPinDelayMax;
  Super_Gate_t *local_188;
  Super_Gate_t *local_180;
  Super_Gate_t *local_178;
  Super_Gate_t *local_170;
  Mio_Gate_t **local_168;
  Super_Gate_t *local_160;
  uint local_158;
  float local_154;
  Super_Gate_t *local_150;
  Super_Gate_t *local_148;
  Super_Gate_t *local_140;
  uint uTruth [2];
  timespec ts;
  int nGates;
  ABC_PTRUINT_T Key;
  undefined8 local_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  float tPinDelaysRes [6];
  long local_68;
  ulong local_60;
  long local_50;
  
  if (6 < nVarsMax) {
    __assert_fail("nVarsMax < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                  ,0xb4,
                  "Vec_Str_t *Super_PrecomputeStr(Mio_Library_t *, int, int, int, float, float, int, int, int)"
                 );
  }
  if (nGatesMax < nVarsMax && nGatesMax != 0) {
    Super_PrecomputeStr_cold_1();
  }
  else {
    local_168 = Mio_CollectRoots(pLibGen,nVarsMax,tDelayMax,0,&nGates,fVerbose);
    if ((nGatesMax != 0) && (nGatesMax <= nGates)) {
      fwrite("Warning! Genlib library contains more gates than can be computed.\n",0x42,1,_stdout);
      fwrite("Only one-gate supergates are included in the supergate library.\n",0x40,1,_stdout);
    }
    pMan = (Super_Man_t *)calloc(1,0xe8);
    pEVar16 = Extra_MmFixedStart(0x70);
    pMan->pMem = pEVar16;
    psVar17 = stmm_init_table(st__ptrcmp,st__ptrhash);
    pMan->tTable = psVar17;
    pcVar18 = Mio_LibraryReadName(pLibGen);
    pMan->pName = pcVar18;
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv = fSkipInv;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax = tAreaMax;
    pMan->TimeLimit = TimeLimit;
    local_158 = nGatesMax;
    if (TimeLimit == 0) {
      aVar30 = 0;
    }
    else {
      iVar14 = clock_gettime(3,(timespec *)&ts);
      if (iVar14 < 0) {
        lVar29 = -1;
      }
      else {
        lVar29 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      aVar30 = lVar29 + (long)TimeLimit * 1000000;
    }
    ppMVar34 = local_168;
    pMan->TimeStop = aVar30;
    pMan->fVerbose = fVerbose;
    if (nGates != 0) {
      pMan->nVarsMax = nVarsMax;
      pMan->nMints = 1 << ((byte)nVarsMax & 0x1f);
      pMan->nLevels = 0;
      pMan->nGates = nVarsMax;
      ppSVar19 = (Super_Gate_t_conflict **)malloc((long)nVarsMax * 8 + 0x10);
      pMan->pGates = ppSVar19;
      if (0 < nVarsMax) {
        lVar29 = (ulong)(uint)nVarsMax - 1;
        auVar43._8_4_ = (int)lVar29;
        auVar43._0_8_ = lVar29;
        auVar43._12_4_ = (int)((ulong)lVar29 >> 0x20);
        uVar35 = 0;
        auVar43 = auVar43 ^ _DAT_0094e250;
        do {
          pSVar20 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
          pSVar20->pRoot = (Mio_Gate_t *)0x0;
          *(undefined4 *)&pSVar20->field_0x8 = 0;
          pSVar20->uTruth[0] = 0;
          *(undefined1 (*) [16])(pSVar20->uTruth + 1) = (undefined1  [16])0x0;
          pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
          pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
          pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
          pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
          *(undefined1 (*) [16])(pSVar20->pFanins + 5) = (undefined1  [16])0x0;
          pSVar20->ptDelays[1] = 0.0;
          pSVar20->ptDelays[2] = 0.0;
          pSVar20->ptDelays[3] = 0.0;
          pSVar20->ptDelays[4] = 0.0;
          *(undefined1 (*) [16])(pSVar20->ptDelays + 5) = (undefined1  [16])0x0;
          *(int *)&pSVar20->field_0x8 = (int)uVar35 * 0x100 + 1;
          auVar11 = _DAT_0094e250;
          lVar29 = 0;
          local_1a8 = auVar43._0_4_;
          iStack_1a4 = auVar43._4_4_;
          iStack_1a0 = auVar43._8_4_;
          iStack_19c = auVar43._12_4_;
          auVar44 = _DAT_0094e240;
          auVar46 = _DAT_0094f530;
          do {
            auVar48 = auVar44 ^ auVar11;
            if ((bool)(~(auVar48._4_4_ == iStack_1a4 && local_1a8 < auVar48._0_4_ ||
                        iStack_1a4 < auVar48._4_4_) & 1)) {
              *(undefined4 *)((long)pSVar20->ptDelays + lVar29) = 0xc61c3c00;
            }
            if ((auVar48._12_4_ != iStack_19c || auVar48._8_4_ <= iStack_1a0) &&
                auVar48._12_4_ <= iStack_19c) {
              *(undefined4 *)((long)pSVar20->ptDelays + lVar29 + 4) = 0xc61c3c00;
            }
            auVar48 = auVar46 ^ auVar11;
            iVar14 = auVar48._4_4_;
            if (iVar14 <= iStack_1a4 && (iVar14 != iStack_1a4 || auVar48._0_4_ <= local_1a8)) {
              *(undefined4 *)((long)pSVar20->ptDelays + lVar29 + 8) = 0xc61c3c00;
              *(undefined4 *)((long)pSVar20->ptDelays + lVar29 + 0xc) = 0xc61c3c00;
            }
            lVar31 = auVar44._8_8_;
            auVar44._0_8_ = auVar44._0_8_ + 4;
            auVar44._8_8_ = lVar31 + 4;
            lVar31 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 4;
            auVar46._8_8_ = lVar31 + 4;
            lVar29 = lVar29 + 0x10;
          } while ((ulong)(nVarsMax + 3U >> 2) << 4 != lVar29);
          pSVar20->ptDelays[uVar35] = 0.0;
          pMan->pGates[uVar35] = pSVar20;
          Super_AddGateToTable(pMan,pSVar20);
          pMan->pInputs[uVar35] = pSVar20;
          uVar35 = uVar35 + 1;
        } while (uVar35 != (uint)nVarsMax);
      }
      uVar35 = 5;
      if (nVarsMax < 5) {
        uVar35 = (ulong)(uint)nVarsMax;
      }
      uVar28 = 0;
      do {
        if (0 < nVarsMax) {
          uVar26 = 0;
          do {
            if ((uVar28 >> ((uint)uVar26 & 0x1f) & 1) != 0) {
              puVar1 = pMan->pGates[uVar26]->uTruth;
              *puVar1 = *puVar1 | 1 << ((byte)uVar28 & 0x1f);
            }
            uVar26 = uVar26 + 1;
          } while (uVar35 != uVar26);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 >> ((byte)uVar35 & 0x1f) == 0);
      if (nVarsMax == 6) {
        ppSVar19 = pMan->pGates;
        lVar29 = 0;
        do {
          pSVar20 = ppSVar19[lVar29];
          pSVar20->uTruth[1] = pSVar20->uTruth[0];
          lVar29 = lVar29 + 1;
        } while (lVar29 != 5);
        pSVar20 = ppSVar19[5];
        pSVar20->uTruth[0] = 0;
        pSVar20->uTruth[1] = 0xffffffff;
      }
      else if (0 < nVarsMax) {
        ppSVar19 = pMan->pGates;
        uVar35 = 0;
        do {
          ppSVar19[uVar35]->uTruth[1] = 0;
          uVar35 = uVar35 + 1;
        } while ((uint)nVarsMax != uVar35);
      }
      iVar14 = clock_gettime(3,(timespec *)&ts);
      if (iVar14 < 0) {
        local_68 = 1;
      }
      else {
        lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        local_68 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      if (fVerbose != 0) {
        printf("Computing supergates with %d inputs, %d levels, and %d max gates.\n",
               (ulong)(uint)pMan->nVarsMax,(ulong)(uint)nLevels,(ulong)local_158);
        printf("Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
               (double)pMan->tDelayMax,(ulong)(uint)pMan->TimeLimit);
      }
      if (0 < nLevels) {
        local_60 = 1;
LAB_004137a4:
        if (pMan->TimeStop != 0) {
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            lVar29 = -1;
          }
          else {
            lVar29 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if (pMan->TimeStop < lVar29) goto LAB_0041544b;
        }
        iVar15 = clock_gettime(3,(timespec *)&ts);
        iVar14 = nGates;
        if (iVar15 < 0) {
          local_50 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          local_50 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        uVar35 = (ulong)(uint)nGates;
        if (pMan->pGates != (Super_Gate_t_conflict **)0x0) {
          free(pMan->pGates);
        }
        ppSVar19 = (Super_Gate_t_conflict **)malloc((long)pMan->nAdded << 3);
        pMan->pGates = ppSVar19;
        pMan->nGates = 0;
        psVar21 = stmm_init_gen(pMan->tTable);
        while (iVar15 = stmm_gen(psVar21,(char **)&Key,(char **)&ts), iVar15 != 0) {
          if (ts.tv_sec != 0) {
            lVar29 = (long)pMan->nGates;
            pSVar20 = (Super_Gate_t_conflict *)ts.tv_sec;
            do {
              pMan->pGates[lVar29] = pSVar20;
              lVar29 = lVar29 + 1;
              pSVar20 = pSVar20->pNext;
            } while (pSVar20 != (Super_Gate_t_conflict *)0x0);
            pMan->nGates = (int)lVar29;
          }
        }
        stmm_free_gen(psVar21);
        if (10000 < pMan->nGates) {
          printf("Sorting array of %d supergates...\r");
          fflush(_stdout);
        }
        qsort(pMan->pGates,(long)pMan->nGates,8,Super_DelayCompare);
        fVar45 = (*pMan->pGates)->tDelayMax;
        pfVar2 = &pMan->pGates[(long)pMan->nGates + -1]->tDelayMax;
        if (*pfVar2 <= fVar45 && fVar45 != *pfVar2) {
          __assert_fail("Super_DelayCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                        ,0x175,
                        "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)");
        }
        if (10000 < pMan->nGates) {
          printf("                                       \r");
        }
        pPro = Extra_ProgressBarStart((FILE *)_stdout,pMan->TimeLimit);
        iVar15 = clock_gettime(3,(timespec *)&ts);
        if (iVar15 < 0) {
          aVar30 = 999999;
        }
        else {
          aVar30 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000 + 1000000;
        }
        pMan->TimePrint = aVar30;
        __base = (long *)malloc((long)pMan->nGates << 3);
        if (0 < iVar14) {
          fVar45 = 0.0;
          uVar26 = 0;
          do {
            if ((pMan->nLevels < 1) || (iVar14 = Mio_GateReadPinNum(local_168[uVar26]), iVar14 < 4))
            {
              ppMVar34 = local_168;
              dVar42 = Mio_GateReadDelayMax(local_168[uVar26]);
              iVar14 = pMan->nGates;
              if ((long)iVar14 < 1) {
                pSVar33 = (Super_Gate_t *)0x0;
              }
              else {
                iVar15 = pMan->nLevels;
                ppSVar19 = pMan->pGates;
                lVar29 = 0;
                pSVar33 = (Super_Gate_t *)0x0;
                do {
                  pSVar20 = ppSVar19[lVar29];
                  if ((iVar15 < 1) || ((*(uint *)&pSVar20->field_0x8 & 0xfc) < 9)) {
                    __base[(int)pSVar33] = (long)pSVar20;
                    pSVar33 = (Super_Gate_t *)(ulong)((int)pSVar33 + 1);
                    if ((pMan->tDelayMax < pSVar20->tDelayMax + (float)dVar42) &&
                       (0.0 < pMan->tDelayMax)) break;
                  }
                  lVar29 = lVar29 + 1;
                } while (iVar14 != lVar29);
              }
              iVar14 = (int)pSVar33;
              if (pMan->fVerbose != 0) {
                uVar28 = Mio_GateReadPinNum(ppMVar34[uVar26]);
                printf("Trying %d choices for %d inputs\r",pSVar33,(ulong)uVar28);
              }
              if (10000 < iVar14) {
                printf("Sorting array of %d supergates...\r",pSVar33);
              }
              qsort(__base,(long)iVar14,8,Super_AreaCompare);
              if (*(float *)(__base[(long)iVar14 - 1] + 0x48) <= *(float *)(*__base + 0x48) &&
                  *(float *)(*__base + 0x48) != *(float *)(__base[(long)iVar14 - 1] + 0x48)) {
                __assert_fail("Super_AreaCompare( ppGatesLimit, ppGatesLimit + nGatesLimit - 1 ) <= 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                              ,0x1ad,
                              "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                             );
              }
              if (10000 < iVar14) {
                printf("                                       \r");
              }
              ppMVar34 = local_168;
              dVar42 = Mio_GateReadArea(local_168[uVar26]);
              uVar28 = Mio_GateReadPinNum(ppMVar34[uVar26]);
              if (6 < uVar28) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                              ,0x2cc,
                              "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                             );
              }
              local_154 = (float)dVar42;
              switch(uVar28) {
              case 0:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                              ,0x1b7,
                              "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                             );
              case 1:
                if (iVar14 < 1) {
LAB_004152d0:
                  iVar14 = 0;
                }
                else {
                  pSVar41 = (Super_Gate_t *)0x0;
                  iVar14 = 0;
                  local_160 = pSVar33;
                  do {
                    pSVar33 = (Super_Gate_t *)__base[(long)pSVar41];
                    if ((pSVar33 == (Super_Gate_t *)0x0) || (iVar14 != 0)) break;
                    iVar14 = Super_CheckTimeout(pPro,pMan);
                    ppMVar34 = local_168;
                    if ((fSkipInv == 0) ||
                       ((pSVar33->tDelayMax != 0.0 || (NAN(pSVar33->tDelayMax))))) {
                      fVar45 = pSVar33->Area + local_154;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) break;
                      Key = *(ABC_PTRUINT_T *)pSVar33->uTruth;
                      ts.tv_sec = (__time_t)pSVar33->ptDelays;
                      Mio_DeriveGateDelays
                                (local_168[uVar26],(float **)&ts,1,pMan->nVarsMax,-9999.0,
                                 tPinDelaysRes,&tPinDelayMax);
                      Mio_DeriveTruthTable
                                (ppMVar34[uVar26],(uint (*) [2])&Key,1,pMan->nVarsMax,uTruth);
                      iVar15 = Super_CompareGates(pMan,uTruth,fVar45,tPinDelaysRes,pMan->nVarsMax);
                      if (iVar15 != 0) {
                        pMVar8 = ppMVar34[uVar26];
                        local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,tPinDelayMax);
                        iVar15 = pMan->nVarsMax;
                        pSVar20 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
                        *(undefined8 *)&pSVar20->field_0x8 = 0;
                        *(undefined8 *)(pSVar20->uTruth + 1) = 0;
                        pSVar20->pFanins[0] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[5] = (Super_Gate_t *)0x0;
                        pSVar20->Area = 0.0;
                        pSVar20->ptDelays[0] = 0.0;
                        pSVar20->ptDelays[1] = 0.0;
                        pSVar20->ptDelays[2] = 0.0;
                        pSVar20->ptDelays[3] = 0.0;
                        pSVar20->ptDelays[4] = 0.0;
                        *(undefined8 *)(pSVar20->ptDelays + 5) = 0;
                        pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                        pSVar20->pRoot = pMVar8;
                        *&pSVar20->uTruth = uTruth;
                        memcpy(pSVar20->ptDelays,tPinDelaysRes,(long)iVar15 << 2);
                        pSVar20->Area = fVar45;
                        *(undefined4 *)&pSVar20->field_0x8 = 4;
                        pSVar20->pFanins[0] = pSVar33;
                        pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                        pSVar20->tDelayMax = local_170._0_4_;
                        Super_AddGateToTable(pMan,pSVar20);
                        if ((local_158 != 0) && ((int)local_158 < pMan->nClasses))
                        goto LAB_00415318;
                      }
                    }
                    pSVar41 = (Super_Gate_t *)((long)&pSVar41->pRoot + 1);
                  } while (local_160 != pSVar41);
                }
                break;
              case 2:
                if (iVar14 < 1) goto LAB_004152d0;
                pSVar41 = (Super_Gate_t *)0x0;
                iVar14 = 0;
                do {
                  pSVar4 = (Super_Gate_t *)__base[(long)pSVar41];
                  if (pSVar4 == (Super_Gate_t *)0x0) break;
                  fVar47 = pSVar4->Area + local_154;
                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar47)) break;
                  Key = *(ABC_PTRUINT_T *)pSVar4->uTruth;
                  ts.tv_sec = (__time_t)pSVar4->ptDelays;
                  pSVar32 = (Super_Gate_t *)0x0;
                  local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,fVar47);
                  local_188 = pSVar4;
                  local_180 = pSVar41;
                  do {
                    pSVar4 = (Super_Gate_t *)__base[(long)pSVar32];
                    if (pSVar4 == (Super_Gate_t *)0x0) break;
                    if (pSVar41 != pSVar32) {
                      if (iVar14 != 0) goto LAB_00415318;
                      iVar14 = Super_CheckTimeout(pPro,pMan);
                      ppMVar34 = local_168;
                      fVar45 = pSVar4->Area + local_170._0_4_;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) break;
                      local_c0 = *(undefined8 *)pSVar4->uTruth;
                      ts.tv_nsec = (__syscall_slong_t)pSVar4->ptDelays;
                      Mio_DeriveGateDelays
                                (local_168[uVar26],(float **)&ts,2,pMan->nVarsMax,-9999.0,
                                 tPinDelaysRes,&tPinDelayMax);
                      Mio_DeriveTruthTable
                                (ppMVar34[uVar26],(uint (*) [2])&Key,2,pMan->nVarsMax,uTruth);
                      iVar15 = Super_CompareGates(pMan,uTruth,fVar45,tPinDelaysRes,pMan->nVarsMax);
                      pSVar41 = local_180;
                      if (iVar15 != 0) {
                        pMVar8 = ppMVar34[uVar26];
                        local_160 = (Super_Gate_t *)CONCAT44(local_160._4_4_,tPinDelayMax);
                        iVar15 = pMan->nVarsMax;
                        pSVar20 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
                        *(undefined8 *)&pSVar20->field_0x8 = 0;
                        *(undefined8 *)(pSVar20->uTruth + 1) = 0;
                        pSVar20->pFanins[0] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
                        pSVar20->pFanins[5] = (Super_Gate_t *)0x0;
                        pSVar20->Area = 0.0;
                        pSVar20->ptDelays[0] = 0.0;
                        pSVar20->ptDelays[1] = 0.0;
                        pSVar20->ptDelays[2] = 0.0;
                        pSVar20->ptDelays[3] = 0.0;
                        pSVar20->ptDelays[4] = 0.0;
                        *(undefined8 *)(pSVar20->ptDelays + 5) = 0;
                        pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                        pSVar20->pRoot = pMVar8;
                        *&pSVar20->uTruth = uTruth;
                        memcpy(pSVar20->ptDelays,tPinDelaysRes,(long)iVar15 << 2);
                        pSVar20->Area = fVar45;
                        *(undefined4 *)&pSVar20->field_0x8 = 8;
                        pSVar20->pFanins[0] = local_188;
                        pSVar20->pFanins[1] = pSVar4;
                        pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                        pSVar20->tDelayMax = local_160._0_4_;
                        Super_AddGateToTable(pMan,pSVar20);
                        pSVar41 = local_180;
                        if ((local_158 != 0) && ((int)local_158 < pMan->nClasses))
                        goto LAB_00415318;
                      }
                    }
                    pSVar32 = (Super_Gate_t *)((long)&pSVar32->pRoot + 1);
                  } while (pSVar33 != pSVar32);
                  pSVar41 = (Super_Gate_t *)((long)&pSVar41->pRoot + 1);
                } while (pSVar41 != pSVar33);
                break;
              case 3:
                if (iVar14 < 1) goto LAB_004152d0;
                pSVar41 = (Super_Gate_t *)0x0;
                iVar14 = 0;
                local_178 = pSVar33;
                do {
                  pSVar4 = (Super_Gate_t *)__base[(long)pSVar41];
                  if (pSVar4 == (Super_Gate_t *)0x0) break;
                  fVar47 = pSVar4->Area + local_154;
                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar47)) break;
                  Key = *(ABC_PTRUINT_T *)pSVar4->uTruth;
                  ts.tv_sec = (__time_t)pSVar4->ptDelays;
                  pSVar32 = (Super_Gate_t *)0x0;
                  local_188 = pSVar41;
                  local_140 = pSVar4;
                  do {
                    pSVar4 = (Super_Gate_t *)__base[(long)pSVar32];
                    if (pSVar4 == (Super_Gate_t *)0x0) break;
                    if (pSVar32 != pSVar41) {
                      fVar49 = pSVar4->Area + fVar47;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar49)) break;
                      local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,fVar49);
                      local_c0 = *(undefined8 *)pSVar4->uTruth;
                      ts.tv_nsec = (__syscall_slong_t)pSVar4->ptDelays;
                      pSVar37 = (Super_Gate_t *)0x0;
                      local_180 = pSVar32;
                      local_150 = pSVar4;
                      do {
                        pSVar4 = (Super_Gate_t *)__base[(long)pSVar37];
                        if (pSVar4 == (Super_Gate_t *)0x0) break;
                        if (pSVar32 != pSVar37 && pSVar41 != pSVar37) {
                          if (iVar14 != 0) goto LAB_00415318;
                          iVar14 = Super_CheckTimeout(pPro,pMan);
                          ppMVar34 = local_168;
                          fVar45 = pSVar4->Area + local_170._0_4_;
                          if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) break;
                          local_b8 = pSVar4->uTruth[0];
                          local_b4 = pSVar4->uTruth[1];
                          Mio_DeriveGateDelays
                                    (local_168[uVar26],(float **)&ts,3,pMan->nVarsMax,-9999.0,
                                     tPinDelaysRes,&tPinDelayMax);
                          Mio_DeriveTruthTable
                                    (ppMVar34[uVar26],(uint (*) [2])&Key,3,pMan->nVarsMax,uTruth);
                          iVar15 = Super_CompareGates(pMan,uTruth,fVar45,tPinDelaysRes,
                                                      pMan->nVarsMax);
                          pSVar41 = local_188;
                          pSVar32 = local_180;
                          pSVar33 = local_178;
                          if (iVar15 != 0) {
                            pMVar8 = ppMVar34[uVar26];
                            local_160 = (Super_Gate_t *)CONCAT44(local_160._4_4_,tPinDelayMax);
                            iVar15 = pMan->nVarsMax;
                            pSVar20 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
                            *(undefined8 *)&pSVar20->field_0x8 = 0;
                            *(undefined8 *)(pSVar20->uTruth + 1) = 0;
                            pSVar20->pFanins[0] = (Super_Gate_t *)0x0;
                            pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
                            pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
                            pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
                            pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
                            pSVar20->pFanins[5] = (Super_Gate_t *)0x0;
                            pSVar20->Area = 0.0;
                            pSVar20->ptDelays[0] = 0.0;
                            pSVar20->ptDelays[1] = 0.0;
                            pSVar20->ptDelays[2] = 0.0;
                            pSVar20->ptDelays[3] = 0.0;
                            pSVar20->ptDelays[4] = 0.0;
                            *(undefined8 *)(pSVar20->ptDelays + 5) = 0;
                            pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                            pSVar20->pRoot = pMVar8;
                            *&pSVar20->uTruth = uTruth;
                            memcpy(pSVar20->ptDelays,tPinDelaysRes,(long)iVar15 << 2);
                            pSVar20->Area = fVar45;
                            *(undefined4 *)&pSVar20->field_0x8 = 0xc;
                            pSVar20->pFanins[0] = local_140;
                            pSVar20->pFanins[1] = local_150;
                            pSVar20->pFanins[2] = pSVar4;
                            pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                            pSVar20->tDelayMax = local_160._0_4_;
                            Super_AddGateToTable(pMan,pSVar20);
                            pSVar41 = local_188;
                            pSVar32 = local_180;
                            pSVar33 = local_178;
                            if ((local_158 != 0) && ((int)local_158 < pMan->nClasses))
                            goto LAB_00415318;
                          }
                        }
                        pSVar37 = (Super_Gate_t *)((long)&pSVar37->pRoot + 1);
                      } while (pSVar33 != pSVar37);
                    }
                    pSVar32 = (Super_Gate_t *)((long)&pSVar32->pRoot + 1);
                  } while (pSVar32 != pSVar33);
                  pSVar41 = (Super_Gate_t *)((long)&pSVar41->pRoot + 1);
                } while (pSVar41 != pSVar33);
                break;
              case 4:
                if (iVar14 < 1) goto LAB_004152d0;
                pSVar41 = (Super_Gate_t *)0x0;
                iVar14 = 0;
                local_140 = pSVar33;
                do {
                  pSVar4 = (Super_Gate_t *)__base[(long)pSVar41];
                  if (pSVar4 == (Super_Gate_t *)0x0) break;
                  fVar47 = pSVar4->Area + local_154;
                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar47)) break;
                  Key = *(ABC_PTRUINT_T *)pSVar4->uTruth;
                  ts.tv_sec = (__time_t)pSVar4->ptDelays;
                  pSVar32 = (Super_Gate_t *)0x0;
                  local_188 = (Super_Gate_t *)CONCAT44(local_188._4_4_,fVar47);
                  local_150 = pSVar41;
                  do {
                    local_148 = (Super_Gate_t *)__base[(long)pSVar32];
                    if (local_148 == (Super_Gate_t *)0x0) break;
                    if (pSVar32 != pSVar41) {
                      fVar49 = local_148->Area + fVar47;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar49)) break;
                      local_c0 = *(undefined8 *)local_148->uTruth;
                      ts.tv_nsec = (__syscall_slong_t)local_148->ptDelays;
                      pSVar37 = (Super_Gate_t *)0x0;
                      local_178 = pSVar32;
                      do {
                        pSVar39 = (Super_Gate_t *)__base[(long)pSVar37];
                        if (pSVar39 == (Super_Gate_t *)0x0) break;
                        if (pSVar37 != pSVar32 && pSVar37 != pSVar41) {
                          fVar50 = pSVar39->Area + fVar49;
                          if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar50)) break;
                          local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,fVar50);
                          local_b8 = pSVar39->uTruth[0];
                          local_b4 = pSVar39->uTruth[1];
                          pSVar36 = (Super_Gate_t *)0x0;
                          local_180 = pSVar37;
                          do {
                            pSVar27 = (Super_Gate_t *)__base[(long)pSVar36];
                            if (pSVar27 == (Super_Gate_t *)0x0) break;
                            if (((pSVar37 != pSVar36) && (pSVar41 != pSVar36)) &&
                               (pSVar32 != pSVar36)) {
                              if (iVar14 != 0) goto LAB_00415318;
                              iVar14 = Super_CheckTimeout(pPro,pMan);
                              ppMVar34 = local_168;
                              fVar45 = pSVar27->Area + local_170._0_4_;
                              if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) {
                                pSVar37 = local_180;
                                fVar47 = local_188._0_4_;
                                break;
                              }
                              local_b0 = pSVar27->uTruth[0];
                              local_ac = pSVar27->uTruth[1];
                              Mio_DeriveGateDelays
                                        (local_168[uVar26],(float **)&ts,4,pMan->nVarsMax,-9999.0,
                                         tPinDelaysRes,&tPinDelayMax);
                              Mio_DeriveTruthTable
                                        (ppMVar34[uVar26],(uint (*) [2])&Key,4,pMan->nVarsMax,uTruth
                                        );
                              iVar15 = Super_CompareGates(pMan,uTruth,fVar45,tPinDelaysRes,
                                                          pMan->nVarsMax);
                              if (iVar15 != 0) {
                                pMVar8 = ppMVar34[uVar26];
                                local_160 = (Super_Gate_t *)CONCAT44(local_160._4_4_,tPinDelayMax);
                                iVar15 = pMan->nVarsMax;
                                pSVar20 = (Super_Gate_t_conflict *)
                                          Extra_MmFixedEntryFetch(pMan->pMem);
                                *(undefined8 *)&pSVar20->field_0x8 = 0;
                                *(undefined8 *)(pSVar20->uTruth + 1) = 0;
                                pSVar20->pFanins[0] = (Super_Gate_t *)0x0;
                                pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
                                pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
                                pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
                                pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
                                pSVar20->pFanins[5] = (Super_Gate_t *)0x0;
                                pSVar20->Area = 0.0;
                                pSVar20->ptDelays[0] = 0.0;
                                pSVar20->ptDelays[1] = 0.0;
                                pSVar20->ptDelays[2] = 0.0;
                                pSVar20->ptDelays[3] = 0.0;
                                pSVar20->ptDelays[4] = 0.0;
                                *(undefined8 *)(pSVar20->ptDelays + 5) = 0;
                                pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                                pSVar20->pRoot = pMVar8;
                                *&pSVar20->uTruth = uTruth;
                                memcpy(pSVar20->ptDelays,tPinDelaysRes,(long)iVar15 << 2);
                                pSVar20->Area = fVar45;
                                *(undefined4 *)&pSVar20->field_0x8 = 0x10;
                                pSVar20->pFanins[0] = pSVar4;
                                pSVar20->pFanins[1] = local_148;
                                pSVar20->pFanins[2] = pSVar39;
                                pSVar20->pFanins[3] = pSVar27;
                                pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                                pSVar20->tDelayMax = local_160._0_4_;
                                Super_AddGateToTable(pMan,pSVar20);
                                if (local_158 != 0) {
                                  pSVar33 = local_140;
                                  pSVar37 = local_180;
                                  pSVar41 = local_150;
                                  pSVar32 = local_178;
                                  fVar47 = local_188._0_4_;
                                  if (pMan->nClasses <= (int)local_158) goto LAB_0041491e;
                                  goto LAB_00415318;
                                }
                              }
                              pSVar33 = local_140;
                              pSVar37 = local_180;
                              pSVar41 = local_150;
                              pSVar32 = local_178;
                              fVar47 = local_188._0_4_;
                            }
LAB_0041491e:
                            pSVar36 = (Super_Gate_t *)((long)&pSVar36->pRoot + 1);
                          } while (pSVar33 != pSVar36);
                        }
                        pSVar37 = (Super_Gate_t *)((long)&pSVar37->pRoot + 1);
                      } while (pSVar37 != pSVar33);
                    }
                    pSVar32 = (Super_Gate_t *)((long)&pSVar32->pRoot + 1);
                  } while (pSVar32 != pSVar33);
                  pSVar41 = (Super_Gate_t *)((long)&pSVar41->pRoot + 1);
                } while (pSVar41 != pSVar33);
                break;
              case 5:
                if (iVar14 < 1) goto LAB_004152d0;
                pSVar41 = (Super_Gate_t *)0x0;
                iVar14 = 0;
                do {
                  pSVar4 = (Super_Gate_t *)__base[(long)pSVar41];
                  if (pSVar4 == (Super_Gate_t *)0x0) break;
                  fVar47 = pSVar4->Area + local_154;
                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar47)) break;
                  Key = *(ABC_PTRUINT_T *)pSVar4->uTruth;
                  ts.tv_sec = (__time_t)pSVar4->ptDelays;
                  pSVar32 = (Super_Gate_t *)0x0;
                  local_150 = (Super_Gate_t *)CONCAT44(local_150._4_4_,fVar47);
                  local_148 = pSVar41;
                  do {
                    pSVar37 = (Super_Gate_t *)__base[(long)pSVar32];
                    if (pSVar37 == (Super_Gate_t *)0x0) break;
                    if (pSVar32 != pSVar41) {
                      fVar49 = pSVar37->Area + fVar47;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar49)) break;
                      local_c0 = *(undefined8 *)pSVar37->uTruth;
                      ts.tv_nsec = (__syscall_slong_t)pSVar37->ptDelays;
                      pSVar39 = (Super_Gate_t *)0x0;
                      local_178 = (Super_Gate_t *)CONCAT44(local_178._4_4_,fVar49);
                      local_140 = pSVar32;
                      do {
                        pSVar36 = (Super_Gate_t *)__base[(long)pSVar39];
                        if (pSVar36 == (Super_Gate_t *)0x0) break;
                        if (pSVar39 != pSVar32 && pSVar39 != pSVar41) {
                          fVar50 = pSVar36->Area + fVar49;
                          if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar50)) break;
                          local_b8 = pSVar36->uTruth[0];
                          local_b4 = pSVar36->uTruth[1];
                          pSVar27 = (Super_Gate_t *)0x0;
                          local_188 = (Super_Gate_t *)CONCAT44(local_188._4_4_,fVar50);
                          do {
                            pSVar5 = (Super_Gate_t *)__base[(long)pSVar27];
                            if (pSVar5 == (Super_Gate_t *)0x0) break;
                            if (((pSVar27 != pSVar39) && (pSVar27 != pSVar41)) &&
                               (pSVar27 != pSVar32)) {
                              fVar51 = pSVar5->Area + fVar50;
                              if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar51)) break;
                              local_180 = (Super_Gate_t *)CONCAT44(local_180._4_4_,fVar51);
                              local_b0 = pSVar5->uTruth[0];
                              local_ac = pSVar5->uTruth[1];
                              pSVar22 = (Super_Gate_t *)0x0;
                              local_170 = pSVar27;
                              do {
                                pSVar6 = (Super_Gate_t *)__base[(long)pSVar22];
                                if (pSVar6 == (Super_Gate_t *)0x0) break;
                                if (((pSVar27 != pSVar22) && (pSVar39 != pSVar22)) &&
                                   ((pSVar41 != pSVar22 && (pSVar32 != pSVar22)))) {
                                  if (iVar14 != 0) goto LAB_00415318;
                                  iVar14 = Super_CheckTimeout(pPro,pMan);
                                  ppMVar34 = local_168;
                                  fVar45 = pSVar6->Area + local_180._0_4_;
                                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) {
                                    pSVar27 = local_170;
                                    fVar47 = local_150._0_4_;
                                    fVar49 = local_178._0_4_;
                                    fVar50 = local_188._0_4_;
                                    break;
                                  }
                                  local_a8 = pSVar6->uTruth[0];
                                  local_a4 = pSVar6->uTruth[1];
                                  Mio_DeriveGateDelays
                                            (local_168[uVar26],(float **)&ts,5,pMan->nVarsMax,
                                             -9999.0,tPinDelaysRes,&tPinDelayMax);
                                  Mio_DeriveTruthTable
                                            (ppMVar34[uVar26],(uint (*) [2])&Key,5,pMan->nVarsMax,
                                             uTruth);
                                  iVar15 = Super_CompareGates(pMan,uTruth,fVar45,tPinDelaysRes,
                                                              pMan->nVarsMax);
                                  if (iVar15 != 0) {
                                    pMVar8 = ppMVar34[uVar26];
                                    local_160 = (Super_Gate_t *)
                                                CONCAT44(local_160._4_4_,tPinDelayMax);
                                    iVar15 = pMan->nVarsMax;
                                    pSVar20 = (Super_Gate_t_conflict *)
                                              Extra_MmFixedEntryFetch(pMan->pMem);
                                    *(undefined8 *)&pSVar20->field_0x8 = 0;
                                    *(undefined8 *)(pSVar20->uTruth + 1) = 0;
                                    pSVar20->pFanins[0] = (Super_Gate_t *)0x0;
                                    pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
                                    pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
                                    pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
                                    pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
                                    pSVar20->pFanins[5] = (Super_Gate_t *)0x0;
                                    pSVar20->Area = 0.0;
                                    pSVar20->ptDelays[0] = 0.0;
                                    pSVar20->ptDelays[1] = 0.0;
                                    pSVar20->ptDelays[2] = 0.0;
                                    pSVar20->ptDelays[3] = 0.0;
                                    pSVar20->ptDelays[4] = 0.0;
                                    *(undefined8 *)(pSVar20->ptDelays + 5) = 0;
                                    pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                                    pSVar20->pRoot = pMVar8;
                                    *&pSVar20->uTruth = uTruth;
                                    memcpy(pSVar20->ptDelays,tPinDelaysRes,(long)iVar15 << 2);
                                    pSVar20->Area = fVar45;
                                    *(undefined4 *)&pSVar20->field_0x8 = 0x14;
                                    pSVar20->pFanins[0] = pSVar4;
                                    pSVar20->pFanins[1] = pSVar37;
                                    pSVar20->pFanins[2] = pSVar36;
                                    pSVar20->pFanins[3] = pSVar5;
                                    pSVar20->pFanins[4] = pSVar6;
                                    pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                                    pSVar20->tDelayMax = local_160._0_4_;
                                    Super_AddGateToTable(pMan,pSVar20);
                                    if (local_158 != 0) {
                                      pSVar27 = local_170;
                                      pSVar41 = local_148;
                                      pSVar32 = local_140;
                                      fVar47 = local_150._0_4_;
                                      fVar49 = local_178._0_4_;
                                      fVar50 = local_188._0_4_;
                                      if (pMan->nClasses <= (int)local_158) goto LAB_00414503;
                                      goto LAB_00415318;
                                    }
                                  }
                                  pSVar27 = local_170;
                                  pSVar41 = local_148;
                                  pSVar32 = local_140;
                                  fVar47 = local_150._0_4_;
                                  fVar49 = local_178._0_4_;
                                  fVar50 = local_188._0_4_;
                                }
LAB_00414503:
                                pSVar22 = (Super_Gate_t *)((long)&pSVar22->pRoot + 1);
                              } while (pSVar33 != pSVar22);
                            }
                            pSVar27 = (Super_Gate_t *)((long)&pSVar27->pRoot + 1);
                          } while (pSVar27 != pSVar33);
                        }
                        pSVar39 = (Super_Gate_t *)((long)&pSVar39->pRoot + 1);
                      } while (pSVar39 != pSVar33);
                    }
                    pSVar32 = (Super_Gate_t *)((long)&pSVar32->pRoot + 1);
                  } while (pSVar32 != pSVar33);
                  pSVar41 = (Super_Gate_t *)((long)&pSVar41->pRoot + 1);
                } while (pSVar41 != pSVar33);
                break;
              case 6:
                if (iVar14 < 1) goto LAB_004152d0;
                pSVar41 = (Super_Gate_t *)0x0;
                iVar14 = 0;
                do {
                  pSVar4 = (Super_Gate_t *)__base[(long)pSVar41];
                  if (pSVar4 == (Super_Gate_t *)0x0) break;
                  fVar47 = pSVar4->Area + local_154;
                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar47)) break;
                  Key = *(ABC_PTRUINT_T *)pSVar4->uTruth;
                  ts.tv_sec = (__time_t)pSVar4->ptDelays;
                  pSVar32 = (Super_Gate_t *)0x0;
                  local_178 = (Super_Gate_t *)CONCAT44(local_178._4_4_,fVar47);
                  do {
                    pSVar37 = (Super_Gate_t *)__base[(long)pSVar32];
                    if (pSVar37 == (Super_Gate_t *)0x0) break;
                    if (pSVar32 != pSVar41) {
                      fVar49 = pSVar37->Area + fVar47;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar49)) break;
                      local_c0 = *(undefined8 *)pSVar37->uTruth;
                      ts.tv_nsec = (__syscall_slong_t)pSVar37->ptDelays;
                      pSVar39 = (Super_Gate_t *)0x0;
                      local_188 = (Super_Gate_t *)CONCAT44(local_188._4_4_,fVar49);
                      local_148 = pSVar32;
                      do {
                        pSVar36 = (Super_Gate_t *)__base[(long)pSVar39];
                        if (pSVar36 == (Super_Gate_t *)0x0) break;
                        if (pSVar39 != pSVar32 && pSVar39 != pSVar41) {
                          fVar50 = pSVar36->Area + fVar49;
                          if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar50)) break;
                          local_b8 = pSVar36->uTruth[0];
                          local_b4 = pSVar36->uTruth[1];
                          pSVar27 = (Super_Gate_t *)0x0;
                          local_180 = pSVar39;
                          do {
                            pSVar5 = (Super_Gate_t *)__base[(long)pSVar27];
                            if (pSVar5 == (Super_Gate_t *)0x0) break;
                            if (((pSVar27 != pSVar39) && (pSVar27 != pSVar41)) &&
                               (pSVar27 != pSVar32)) {
                              fVar51 = pSVar5->Area + fVar50;
                              if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar51)) break;
                              local_b0 = pSVar5->uTruth[0];
                              local_ac = pSVar5->uTruth[1];
                              pSVar22 = (Super_Gate_t *)0x0;
                              local_170 = pSVar27;
                              do {
                                pSVar6 = (Super_Gate_t *)__base[(long)pSVar22];
                                if (pSVar6 == (Super_Gate_t *)0x0) break;
                                if (((pSVar22 != pSVar27) && (pSVar22 != pSVar39)) &&
                                   ((pSVar22 != pSVar41 && (pSVar22 != pSVar32)))) {
                                  if (iVar14 != 0) {
                                    iVar14 = 1;
                                    break;
                                  }
                                  local_160 = pSVar22;
                                  iVar14 = Super_CheckTimeout(pPro,pMan);
                                  local_140 = (Super_Gate_t *)
                                              CONCAT44(local_140._4_4_,pSVar6->Area + fVar51);
                                  pSVar27 = local_170;
                                  pSVar39 = local_180;
                                  fVar47 = local_178._0_4_;
                                  fVar49 = local_188._0_4_;
                                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) break;
                                  local_a8 = pSVar6->uTruth[0];
                                  local_a4 = pSVar6->uTruth[1];
                                  pSVar38 = (Super_Gate_t *)0x0;
                                  pSVar22 = local_160;
                                  do {
                                    pSVar7 = (Super_Gate_t *)__base[(long)pSVar38];
                                    if (pSVar7 == (Super_Gate_t *)0x0) break;
                                    if ((((pSVar22 != pSVar38) && (pSVar27 != pSVar38)) &&
                                        (pSVar39 != pSVar38)) &&
                                       ((pSVar41 != pSVar38 && (pSVar32 != pSVar38)))) {
                                      if (iVar14 != 0) goto LAB_00415318;
                                      iVar14 = Super_CheckTimeout(pPro,pMan);
                                      ppMVar34 = local_168;
                                      fVar45 = pSVar7->Area + local_140._0_4_;
                                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar45)) {
                                        pSVar22 = local_160;
                                        pSVar27 = local_170;
                                        pSVar39 = local_180;
                                        fVar47 = local_178._0_4_;
                                        fVar49 = local_188._0_4_;
                                        break;
                                      }
                                      local_a0 = pSVar7->uTruth[0];
                                      local_9c = pSVar7->uTruth[1];
                                      Mio_DeriveGateDelays
                                                (local_168[uVar26],(float **)&ts,6,pMan->nVarsMax,
                                                 -9999.0,tPinDelaysRes,&tPinDelayMax);
                                      Mio_DeriveTruthTable
                                                (ppMVar34[uVar26],(uint (*) [2])&Key,6,
                                                 pMan->nVarsMax,uTruth);
                                      iVar15 = Super_CompareGates(pMan,uTruth,fVar45,tPinDelaysRes,
                                                                  pMan->nVarsMax);
                                      if (iVar15 != 0) {
                                        pMVar8 = ppMVar34[uVar26];
                                        local_150 = (Super_Gate_t *)
                                                    CONCAT44(local_150._4_4_,tPinDelayMax);
                                        iVar15 = pMan->nVarsMax;
                                        pSVar20 = (Super_Gate_t_conflict *)
                                                  Extra_MmFixedEntryFetch(pMan->pMem);
                                        *(undefined8 *)&pSVar20->field_0x8 = 0;
                                        *(undefined8 *)(pSVar20->uTruth + 1) = 0;
                                        pSVar20->pFanins[0] = (Super_Gate_t *)0x0;
                                        pSVar20->pFanins[1] = (Super_Gate_t *)0x0;
                                        pSVar20->pFanins[2] = (Super_Gate_t *)0x0;
                                        pSVar20->pFanins[3] = (Super_Gate_t *)0x0;
                                        pSVar20->pFanins[4] = (Super_Gate_t *)0x0;
                                        pSVar20->pFanins[5] = (Super_Gate_t *)0x0;
                                        pSVar20->Area = 0.0;
                                        pSVar20->ptDelays[0] = 0.0;
                                        pSVar20->ptDelays[1] = 0.0;
                                        pSVar20->ptDelays[2] = 0.0;
                                        pSVar20->ptDelays[3] = 0.0;
                                        pSVar20->ptDelays[4] = 0.0;
                                        *(undefined8 *)(pSVar20->ptDelays + 5) = 0;
                                        pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                                        pSVar20->pRoot = pMVar8;
                                        *&pSVar20->uTruth = uTruth;
                                        memcpy(pSVar20->ptDelays,tPinDelaysRes,(long)iVar15 << 2);
                                        pSVar20->Area = fVar45;
                                        *(undefined4 *)&pSVar20->field_0x8 = 0x18;
                                        pSVar20->pFanins[0] = pSVar4;
                                        pSVar20->pFanins[1] = pSVar37;
                                        pSVar20->pFanins[2] = pSVar36;
                                        pSVar20->pFanins[3] = pSVar5;
                                        pSVar20->pFanins[4] = pSVar6;
                                        pSVar20->pFanins[5] = pSVar7;
                                        pSVar20->pNext = (Super_Gate_t_conflict *)0x0;
                                        pSVar20->tDelayMax = local_150._0_4_;
                                        Super_AddGateToTable(pMan,pSVar20);
                                        if (local_158 != 0) {
                                          pSVar22 = local_160;
                                          pSVar27 = local_170;
                                          pSVar39 = local_180;
                                          pSVar32 = local_148;
                                          fVar47 = local_178._0_4_;
                                          fVar49 = local_188._0_4_;
                                          if (pMan->nClasses <= (int)local_158) goto LAB_00415247;
                                          goto LAB_00415318;
                                        }
                                      }
                                      pSVar22 = local_160;
                                      pSVar27 = local_170;
                                      pSVar39 = local_180;
                                      pSVar32 = local_148;
                                      fVar47 = local_178._0_4_;
                                      fVar49 = local_188._0_4_;
                                    }
LAB_00415247:
                                    pSVar38 = (Super_Gate_t *)((long)&pSVar38->pRoot + 1);
                                  } while (pSVar33 != pSVar38);
                                }
                                pSVar22 = (Super_Gate_t *)((long)&pSVar22->pRoot + 1);
                              } while (pSVar22 != pSVar33);
                            }
                            pSVar27 = (Super_Gate_t *)((long)&pSVar27->pRoot + 1);
                          } while (pSVar27 != pSVar33);
                        }
                        pSVar39 = (Super_Gate_t *)((long)&pSVar39->pRoot + 1);
                      } while (pSVar39 != pSVar33);
                    }
                    pSVar32 = (Super_Gate_t *)((long)&pSVar32->pRoot + 1);
                  } while (pSVar32 != pSVar33);
                  pSVar41 = (Super_Gate_t *)((long)&pSVar41->pRoot + 1);
                } while (pSVar41 != pSVar33);
              }
            }
            else {
              iVar14 = 0;
            }
            uVar26 = uVar26 + 1;
          } while ((uVar26 < uVar35) && (iVar14 == 0));
        }
        Extra_ProgressBarStop(pPro);
        if (__base != (long *)0x0) goto LAB_0041533a;
        goto LAB_0041533f;
      }
LAB_0041544b:
      iVar14 = clock_gettime(3,(timespec *)&ts);
      ppMVar34 = local_168;
      if (iVar14 < 0) {
        lVar29 = -1;
      }
      else {
        lVar29 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      pMan->Time = lVar29 + local_68;
      if (fVerbose != 0) {
        puts("Writing the output file...");
        fflush(_stdout);
      }
      if (pMan->nGates < 1) {
        puts("The generated library is empty. No output file written.");
        pVVar25 = (Vec_Str_t *)0x0;
      }
      else {
        if (pMan->pGates != (Super_Gate_t_conflict **)0x0) {
          free(pMan->pGates);
        }
        ppSVar19 = (Super_Gate_t_conflict **)malloc((long)pMan->nAdded << 3);
        pMan->pGates = ppSVar19;
        pMan->nGates = 0;
        psVar21 = stmm_init_gen(pMan->tTable);
        iVar14 = stmm_gen(psVar21,(char **)tPinDelaysRes,(char **)&Key);
        if (iVar14 != 0) {
          pSVar20 = (Super_Gate_t_conflict *)Key;
          do {
            for (; pSVar20 != (Super_Gate_t_conflict *)0x0; pSVar20 = pSVar20->pNext) {
              if (pSVar20->pRoot != (Mio_Gate_t *)0x0) {
                if (0 < (long)pMan->nVarsMax) {
                  lVar29 = 0;
                  bVar10 = false;
                  do {
                    bVar13 = true;
                    if ((-9998.999 <= pSVar20->ptDelays[lVar29]) && (bVar13 = false, bVar10))
                    goto LAB_004155bd;
                    bVar10 = bVar13;
                    lVar29 = lVar29 + 1;
                  } while (pMan->nVarsMax != lVar29);
                }
                iVar14 = pMan->nGates;
                pMan->nGates = iVar14 + 1;
                pMan->pGates[iVar14] = pSVar20;
              }
LAB_004155bd:
            }
            iVar14 = stmm_gen(psVar21,(char **)tPinDelaysRes,(char **)&Key);
            pSVar20 = (Super_Gate_t_conflict *)Key;
          } while (iVar14 != 0);
        }
        stmm_free_gen(psVar21);
        iVar14 = clock_gettime(3,(timespec *)&ts);
        if (iVar14 < 0) {
          lVar29 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        ppSVar19 = pMan->pGates;
        qsort(ppSVar19,(long)pMan->nGates,8,Super_WriteCompare);
        pSVar20 = *pMan->pGates;
        pSVar9 = pMan->pGates[(long)pMan->nGates + -1];
        uVar28 = pSVar9->uTruth[1];
        uVar3 = pSVar20->uTruth[1];
        if ((uVar28 <= uVar3) && ((uVar28 < uVar3 || (pSVar9->uTruth[0] < pSVar20->uTruth[0])))) {
          __assert_fail("Super_WriteCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                        ,0x402,"Vec_Str_t *Super_Write(Super_Man_t *)");
        }
        if (pMan->fVerbose != 0) {
          Abc_Print((int)ppSVar19,"%s =","Sorting");
          iVar15 = 3;
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            lVar31 = -1;
          }
          else {
            lVar31 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar31 + lVar29) / 1000000.0);
        }
        iVar15 = 3;
        iVar14 = clock_gettime(3,(timespec *)&ts);
        if (iVar14 < 0) {
          lVar29 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        if (pMan->fWriteOldFormat != 0) {
          pcVar18 = (char *)malloc(10000);
          pcVar23 = Extra_FileNameGeneric(pMan->pName);
          sprintf(pcVar18,"%s.super_old",pcVar23);
          if (pcVar23 != (char *)0x0) {
            free(pcVar23);
          }
          pMan->nUnique = 1;
          iVar14 = pMan->nGates;
          if (0 < (long)iVar14) {
            iVar15 = 1;
            uVar35 = 0;
            pSVar20 = *pMan->pGates;
            do {
              if ((pSVar20 == (Super_Gate_t_conflict *)0x0) || (iVar14 - 1 == uVar35)) break;
              pSVar9 = pMan->pGates[uVar35 + 1];
              if ((pSVar9->uTruth[0] != pSVar20->uTruth[0]) ||
                 (pSVar9->uTruth[1] != pSVar20->uTruth[1])) {
                iVar15 = iVar15 + 1;
                pMan->nUnique = iVar15;
              }
              uVar35 = uVar35 + 1;
              pSVar20 = pSVar9;
            } while ((long)iVar14 != uVar35);
          }
          __s = fopen(pcVar18,"w");
          fwrite("#\n",2,1,__s);
          pcVar23 = pMan->pName;
          lVar31 = 0;
          pcVar24 = Extra_TimeStamp();
          fprintf(__s,"# Supergate library derived for \"%s\" on %s.\n",pcVar23,pcVar24);
          fwrite("#\n",2,1,__s);
          pcVar23 = "";
          if (pMan->fSkipInv == 0) {
            pcVar23 = "-s";
          }
          fprintf(__s,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n",
                  (double)pMan->tDelayMax,(double)pMan->tAreaMax,(ulong)(uint)pMan->nVarsMax,
                  (ulong)(uint)pMan->nLevels,(ulong)(uint)pMan->nGatesMax,
                  (ulong)(uint)pMan->TimeLimit,pcVar23,pMan->pName);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
          fprintf(__s,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
          fprintf(__s,"# The maximum delay         = %10.2f.\n",(double)pMan->tDelayMax);
          fprintf(__s,"# The maximum area          = %10.2f.\n",(double)pMan->tAreaMax);
          fprintf(__s,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
          fprintf(__s,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
          fprintf(__s,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
          ldexp(1.0,pMan->nMints);
          fprintf(__s,"# The total functions       = %.0f (2^%d).\n",(ulong)(uint)pMan->nMints);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# Generation time           = %10.2f sec.\n",
                  (double)((float)pMan->Time / 1e+06));
          fwrite("#\n",2,1,__s);
          fprintf(__s,"%s\n",pMan->pName);
          fprintf(__s,"%d\n",(ulong)(uint)pMan->nVarsMax);
          fprintf(__s,"%d\n",(ulong)(uint)pMan->nGates);
          iVar14 = pMan->nGates;
          if ((0 < iVar14) && (pSVar20 = *pMan->pGates, pSVar20 != (Super_Gate_t_conflict *)0x0)) {
            lVar12 = 1;
            do {
              lVar31 = lVar12;
              Super_WriteLibraryGate((FILE *)__s,pMan,pSVar20,(int)lVar31);
              iVar14 = pMan->nGates;
              if (lVar31 - 1U == (ulong)(iVar14 - 1)) break;
              if ((pMan->pGates[lVar31]->uTruth[0] != pSVar20->uTruth[0]) ||
                 (pMan->pGates[lVar31]->uTruth[1] != pSVar20->uTruth[1])) {
                fputc(10,__s);
                iVar14 = pMan->nGates;
              }
              if (iVar14 <= lVar31) break;
              pSVar20 = pMan->pGates[lVar31];
              lVar12 = lVar31 + 1;
            } while (pSVar20 != (Super_Gate_t_conflict *)0x0);
          }
          if ((int)lVar31 != iVar14) {
            __assert_fail("Counter == pMan->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                          ,0x500,"void Super_WriteLibrary(Super_Man_t *)");
          }
          fclose(__s);
          iVar15 = (int)__s;
          if (pMan->fVerbose != 0) {
            printf("The supergates are written using old format \"%s\" ",pcVar18);
            iVar14 = Extra_FileSize(pcVar18);
            iVar15 = 0x9ca106;
            printf("(%0.3f MB).\n",(double)iVar14 * 9.5367431640625e-07);
          }
          if (pcVar18 != (char *)0x0) {
            free(pcVar18);
            iVar15 = (int)pcVar18;
          }
        }
        if (pMan->fVerbose != 0) {
          Abc_Print(iVar15,"%s =","Writing old format");
          iVar15 = 3;
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            lVar31 = -1;
          }
          else {
            lVar31 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar31 + lVar29) / 1000000.0);
        }
        iVar14 = clock_gettime(3,(timespec *)&ts);
        if (iVar14 < 0) {
          lVar29 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        pSVar40 = pMan;
        pVVar25 = Super_WriteLibraryTreeStr(pMan);
        ppMVar34 = local_168;
        if (pMan->fVerbose != 0) {
          Abc_Print((int)pSVar40,"%s =","Writing new format");
          iVar15 = 3;
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            lVar31 = -1;
          }
          else {
            lVar31 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar31 + lVar29) / 1000000.0);
          ppMVar34 = local_168;
        }
      }
      Super_ManStop(pMan);
      if (ppMVar34 == (Mio_Gate_t **)0x0) {
        return pVVar25;
      }
      free(ppMVar34);
      return pVVar25;
    }
    fwrite("Error: No genlib gates satisfy the limits criteria. Stop.\n",0x3a,1,_stderr);
    fprintf(_stderr,"Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
            (double)pMan->tDelayMax,(double)pMan->tAreaMax,(ulong)(uint)pMan->TimeLimit);
    Super_ManStop(pMan);
    if (ppMVar34 != (Mio_Gate_t **)0x0) {
      free(ppMVar34);
    }
  }
  return (Vec_Str_t *)0x0;
LAB_00415318:
  Extra_ProgressBarStop(pPro);
LAB_0041533a:
  free(__base);
LAB_0041533f:
  iVar14 = (int)local_60;
  pMan->nLevels = iVar14;
  if (fVerbose != 0) {
    iVar14 = 0x9ca392;
    printf("Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. ",
           local_60,(ulong)(uint)pMan->nTried,(ulong)(uint)pMan->nAdded,(ulong)(uint)pMan->nRemoved,
           (ulong)(uint)(pMan->nAdded - pMan->nRemoved),(ulong)(uint)pMan->nLookups,
           (ulong)(uint)pMan->nAliases);
    Abc_Print(iVar14,"%s =","Time");
    iVar15 = 3;
    iVar14 = clock_gettime(3,(timespec *)&ts);
    if (iVar14 < 0) {
      lVar29 = -1;
    }
    else {
      lVar29 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar29 + local_50) / 1000000.0);
    fflush(_stdout);
  }
  local_60 = (ulong)(iVar14 + 1);
  if (iVar14 == nLevels) goto LAB_0041544b;
  goto LAB_004137a4;
}

Assistant:

Vec_Str_t * Super_PrecomputeStr( Mio_Library_t * pLibGen, int nVarsMax, int nLevels, int nGatesMax, float tDelayMax, float tAreaMax, int TimeLimit, int fSkipInv, int fVerbose )
{
    Vec_Str_t * vStr;
    Super_Man_t * pMan;
    Mio_Gate_t ** ppGates;
    int nGates, Level;
    abctime clk, clockStart;

    assert( nVarsMax < 7 );
    if ( nGatesMax && nGatesMax < nVarsMax )
    {
        fprintf( stderr, "Erro! The number of supergates requested (%d) in less than the number of variables (%d).\n", nGatesMax, nVarsMax );
        fprintf( stderr, "The library cannot be computed.\n" );
        return NULL;
    }

    // get the root gates
    ppGates = Mio_CollectRoots( pLibGen, nVarsMax, tDelayMax, 0, &nGates, fVerbose );
    if ( nGatesMax && nGates >= nGatesMax )
    {
        fprintf( stdout, "Warning! Genlib library contains more gates than can be computed.\n");
        fprintf( stdout, "Only one-gate supergates are included in the supergate library.\n" );
    }

    // start the manager
    pMan = Super_ManStart();
    pMan->pName     = Mio_LibraryReadName(pLibGen);
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv  = fSkipInv;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax  = tAreaMax;
    pMan->TimeLimit = TimeLimit; // in seconds
    pMan->TimeStop  = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0; // in CPU ticks
    pMan->fVerbose  = fVerbose;

    if ( nGates == 0 )
    {
        fprintf( stderr, "Error: No genlib gates satisfy the limits criteria. Stop.\n");
        fprintf( stderr, "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
            pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );

        // stop the manager
        Super_ManStop( pMan );
        ABC_FREE( ppGates );

        return NULL;
    }

    // get the starting supergates
    Super_First( pMan, nVarsMax );

    // perform the computation of supergates
    clockStart = Abc_Clock();
if ( fVerbose )
{
    printf( "Computing supergates with %d inputs, %d levels, and %d max gates.\n", 
        pMan->nVarsMax, nLevels, nGatesMax );
    printf( "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
        pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );
}

    for ( Level = 1; Level <= nLevels; Level++ )
    {
        if ( pMan->TimeStop && Abc_Clock() > pMan->TimeStop )
            break;
clk = Abc_Clock();
        Super_Compute( pMan, ppGates, nGates, nGatesMax, fSkipInv );
        pMan->nLevels = Level;
if ( fVerbose )
{
        printf( "Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. ",
           Level, pMan->nTried, pMan->nAdded, pMan->nRemoved, pMan->nAdded - pMan->nRemoved, pMan->nLookups, pMan->nAliases );
ABC_PRT( "Time", Abc_Clock() - clk );
fflush( stdout );
}
    }
    pMan->Time = Abc_Clock() - clockStart;

if ( fVerbose )
{
printf( "Writing the output file...\n" );
fflush( stdout );
}
    // write them into a file
    vStr = Super_Write( pMan );

    // stop the manager
    Super_ManStop( pMan );
    ABC_FREE( ppGates );
    return vStr;
}